

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleRenderInstance::logTestPlan
          (ImageSampleRenderInstance *this)

{
  ostringstream *this_00;
  ShaderInputInterface SVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  int resultNdx;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  ostringstream msg;
  long *local_348;
  long local_340;
  long local_338 [2];
  long local_328 [14];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_328,"Rendering 2x2 grid.\n",0x14);
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"Single descriptor set. Descriptor set contains ",0x2f);
    SVar1 = this->m_shaderInterface;
    if ((ulong)SVar1 < 3) {
      pcVar6 = *(char **)(&DAT_00d59eb8 + (ulong)SVar1 * 8);
    }
    else {
      pcVar6 = (char *)0x0;
      if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        pcVar6 = "an array (size 2) of";
      }
    }
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)&local_348 + (int)*(undefined8 *)(local_328[0] + -0x18) + 0x20);
    }
    else {
      sVar2 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,sVar2);
    }
    lVar4 = 0x3a;
    pcVar6 = " VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER descriptor(s).\n";
  }
  else {
    if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) goto LAB_0054bb64;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"Single descriptor set. Descriptor set contains ",0x2f);
    SVar1 = this->m_shaderInterface;
    if ((ulong)SVar1 < 3) {
      pcVar6 = *(char **)(&DAT_00d59eb8 + (ulong)SVar1 * 8);
    }
    else {
      pcVar6 = (char *)0x0;
      if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        pcVar6 = "an array (size 2) of";
      }
    }
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)&local_348 + (int)*(undefined8 *)(local_328[0] + -0x18) + 0x20);
    }
    else {
      sVar2 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,sVar2);
    }
    lVar4 = 0x40;
    pcVar6 = " VK_DESCRIPTOR_TYPE_SAMPLER descriptor(s) and a single texture.\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,lVar4);
LAB_0054bb64:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_328,"Image view type is ",0x13);
  pcVar6 = ::vk::getImageViewTypeName(this->m_viewType);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)&local_348 + (int)*(undefined8 *)(local_328[0] + -0x18) + 0x20);
  }
  else {
    sVar2 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"\n",1);
  if (this->m_baseMipLevel != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"Image view base mip level = ",0x1c);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_328);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  if (this->m_baseArraySlice != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"Image view base array slice = ",0x1e);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_328);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  bVar7 = this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR;
  pcVar6 = "Sampler 0 mode is LINEAR, with WRAP\nSampler 1 mode is NEAREST with CLAMP\n";
  if (bVar7) {
    pcVar6 = "Sampler mode is LINEAR, with WRAP\n";
  }
  lVar4 = 0x49;
  if (bVar7) {
    lVar4 = 0x22;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,lVar4);
  if (this->m_stageFlags == 0) {
    lVar4 = 0x32;
    pcVar6 = "Descriptors are not accessed in any shader stage.\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"Color in each cell is fetched using the descriptor(s):\n",0x37)
    ;
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"Test sample ",0xc);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_328,uVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": sample at position ",0x15);
      ImageSampleInstanceImages::getSamplePos
                ((ImageSampleInstanceImages *)local_1b0,this->m_viewType,this->m_baseMipLevel,
                 this->m_baseArraySlice,uVar5);
      tcu::operator<<(poVar3,(Vector<float,_4> *)local_1b0);
      if (this->m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) {
        if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
          lVar4 = 0x1d;
          pcVar6 = " from combined image sampler ";
        }
        else {
          if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) goto LAB_0054bd6d;
          lVar4 = 0xf;
          pcVar6 = " using sampler ";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,lVar4);
        std::ostream::operator<<((ostream *)local_328,uVar5 & 1);
      }
LAB_0054bd6d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"\n",1);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"Descriptors are accessed in {",0x1d);
    bVar7 = (this->m_stageFlags & 1) == 0;
    pcVar6 = " vertex";
    if (bVar7) {
      pcVar6 = "";
    }
    lVar4 = 7;
    if (bVar7) {
      lVar4 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,lVar4);
    bVar7 = (this->m_stageFlags & 2) == 0;
    pcVar6 = " tess_control";
    if (bVar7) {
      pcVar6 = "";
    }
    lVar4 = 0xd;
    if (bVar7) {
      lVar4 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,lVar4);
    uVar5 = this->m_stageFlags & 4;
    pcVar6 = " tess_evaluation";
    if (uVar5 == 0) {
      pcVar6 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,pcVar6,(ulong)(uVar5 << 2));
    uVar5 = this->m_stageFlags & 8;
    pcVar6 = " geometry";
    if (uVar5 == 0) {
      pcVar6 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,pcVar6,(ulong)(uVar5 >> 3) * 9);
    uVar5 = this->m_stageFlags & 0x10;
    pcVar6 = " fragment";
    if (uVar5 == 0) {
      pcVar6 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,pcVar6,(ulong)(uVar5 >> 4) * 9);
    lVar4 = 10;
    pcVar6 = " } stages.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,lVar4);
  local_1b0._0_8_ =
       ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.super_TestInstance.
       m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_348,local_340)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::ios_base::~ios_base(local_2b8);
  return;
}

Assistant:

void ImageSampleRenderInstance::logTestPlan (void) const
{
	std::ostringstream msg;

	msg << "Rendering 2x2 grid.\n";

	if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
	{
		msg << "Single descriptor set. Descriptor set contains "
			<< ((m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? "single" :
			    (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) ? "two" :
				(m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS) ? "two" :
			    (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) ? "an array (size 2) of" :
			    (const char*)DE_NULL)
			<< " VK_DESCRIPTOR_TYPE_SAMPLER descriptor(s) and a single texture.\n";
	}
	else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
	{
		msg << "Single descriptor set. Descriptor set contains "
			<< ((m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? "single" :
			    (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) ? "two" :
				(m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS) ? "two" :
			    (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) ? "an array (size 2) of" :
			    (const char*)DE_NULL)
			<< " VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER descriptor(s).\n";
	}
	else
		DE_FATAL("Impossible");

	msg << "Image view type is " << vk::getImageViewTypeName(m_viewType) << "\n";

	if (m_baseMipLevel)
		msg << "Image view base mip level = " << m_baseMipLevel << "\n";
	if (m_baseArraySlice)
		msg << "Image view base array slice = " << m_baseArraySlice << "\n";

	if (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)
		msg << "Sampler mode is LINEAR, with WRAP\n";
	else
		msg << "Sampler 0 mode is LINEAR, with WRAP\nSampler 1 mode is NEAREST with CLAMP\n";

	if (m_stageFlags == 0u)
	{
		msg << "Descriptors are not accessed in any shader stage.\n";
	}
	else
	{
		msg << "Color in each cell is fetched using the descriptor(s):\n";

		for (int resultNdx = 0; resultNdx < 4; ++resultNdx)
		{
			msg << "Test sample " << resultNdx << ": sample at position " << m_images.getSamplePos(m_viewType, m_baseMipLevel, m_baseArraySlice, resultNdx);

			if (m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR)
			{
				const int srcResourceNdx = (resultNdx % 2); // ABAB source

				if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
					msg << " using sampler " << srcResourceNdx;
				else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
					msg << " from combined image sampler " << srcResourceNdx;
				else
					DE_FATAL("Impossible");
			}
			msg << "\n";
		}

		msg << "Descriptors are accessed in {"
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_VERTEX_BIT) != 0)					? (" vertex")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0)	? (" tess_control")		: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0)	? (" tess_evaluation")	: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_GEOMETRY_BIT) != 0)				? (" geometry")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_FRAGMENT_BIT) != 0)				? (" fragment")			: (""))
			<< " } stages.";
	}

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< msg.str()
		<< tcu::TestLog::EndMessage;
}